

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lifetime.h
# Opt level: O1

void __thiscall
Lifetime::AddToUseCountAdjust(Lifetime *this,uint32 newUseValue,Loop *loop,Func *func)

{
  JitArenaAllocator *pJVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  uint32 *__s;
  uint32 *puVar6;
  uint uVar7;
  ulong uVar8;
  size_t sVar9;
  
  if (CARRY4(this->useCountAdjust,newUseValue)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lifetime.h"
                       ,0x91,"((this->useCountAdjust + newUseValue) >= this->useCountAdjust)",
                       "(this->useCountAdjust + newUseValue) >= this->useCountAdjust");
    if (!bVar3) goto LAB_00593eda;
    *puVar5 = 0;
  }
  this->useCountAdjust = this->useCountAdjust + newUseValue;
  if (loop != (Loop *)0x0) {
    if (this->regionUseCount == (uint32 *)0x0) {
      puVar6 = (uint32 *)&DAT_00000008;
      uVar7 = func->loopCount + 1;
      if (uVar7 != 0) {
        pJVar1 = this->alloc;
        BVar4 = ExceptionCheck::CanHandleOutOfMemory();
        if (BVar4 == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar5 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                             ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                             "ExceptionCheck::CanHandleOutOfMemory()");
          if (!bVar3) goto LAB_00593eda;
          *puVar5 = 0;
        }
        uVar8 = (ulong)uVar7;
        sVar9 = uVar8 * 4;
        puVar6 = (uint32 *)
                 Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                 AllocInternal((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *
                               )pJVar1,sVar9);
        memset(puVar6,0,sVar9);
        memset(puVar6 + uVar8,0,(sVar9 + 0xf & 0x7fffffff0) + uVar8 * -4);
        if (puVar6 == (uint32 *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar5 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                             ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
          if (!bVar3) goto LAB_00593eda;
          *puVar5 = 0;
        }
      }
      __s = (uint32 *)&DAT_00000008;
      this->regionUseCount = puVar6;
      uVar7 = func->loopCount + 1;
      if (uVar7 != 0) {
        pJVar1 = this->alloc;
        BVar4 = ExceptionCheck::CanHandleOutOfMemory();
        if (BVar4 == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar5 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                             ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                             "ExceptionCheck::CanHandleOutOfMemory()");
          if (!bVar3) goto LAB_00593eda;
          *puVar5 = 0;
        }
        uVar8 = (ulong)uVar7;
        sVar9 = uVar8 * 4;
        __s = (uint32 *)
              Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
              AllocInternal((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                            pJVar1,sVar9);
        memset(__s,0,sVar9);
        memset(__s + uVar8,0,(sVar9 + 0xf & 0x7fffffff0) + uVar8 * -4);
        if (__s == (uint32 *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar5 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                             ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
          if (!bVar3) {
LAB_00593eda:
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *puVar5 = 0;
        }
      }
      this->regionUseCountAdjust = __s;
    }
    puVar6 = this->regionUseCountAdjust;
    do {
      puVar6[loop->loopNumber] = puVar6[loop->loopNumber] + newUseValue;
      loop = loop->parent;
    } while (loop != (Loop *)0x0);
  }
  return;
}

Assistant:

void AddToUseCountAdjust(uint32 newUseValue, Loop *loop, Func *func)
    {
        Assert((this->useCountAdjust + newUseValue) >= this->useCountAdjust);
        this->useCountAdjust += newUseValue;

        if (loop)
        {
            if (!this->regionUseCount)
            {
                this->regionUseCount = AnewArrayZ(this->alloc, uint32, func->loopCount+1);
                this->regionUseCountAdjust = AnewArrayZ(this->alloc, uint32, func->loopCount+1);
            }
            do
            {
                this->regionUseCountAdjust[loop->loopNumber] += newUseValue;
                loop = loop->parent;
            } while (loop);
        }
    }